

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epanet3.cpp
# Opt level: O3

int EN_cloneProject(EN_Project pClone,EN_Project pSource)

{
  bool bVar1;
  int iVar2;
  undefined1 local_50 [8];
  string tmpFile;
  
  iVar2 = 0x66;
  if (pClone != (EN_Project)0x0 && pSource != (EN_Project)0x0) {
    tmpFile._M_dataplus._M_p = (pointer)0x0;
    tmpFile._M_string_length._0_1_ = 0;
    local_50 = (undefined1  [8])&tmpFile._M_string_length;
    bVar1 = Utilities::getTmpFileName((string *)local_50);
    iVar2 = 0xd0;
    if (bVar1) {
      Epanet::Project::save((Project *)pSource,(char *)local_50);
      iVar2 = 0;
      Epanet::Project::load((Project *)pClone,(char *)local_50);
      remove((char *)local_50);
    }
    if (local_50 != (undefined1  [8])&tmpFile._M_string_length) {
      operator_delete((void *)local_50);
    }
  }
  return iVar2;
}

Assistant:

int EN_cloneProject(EN_Project pClone, EN_Project pSource)
{
    if ( pSource == nullptr || pClone == nullptr ) return 102;
    int err = 0;
    std::string tmpFile;
    if ( Utilities::getTmpFileName(tmpFile) )
    {
        try
        {
            EN_saveProject(tmpFile.c_str(), pSource);
            EN_loadProject(tmpFile.c_str(), pClone);
        }
        catch (ENerror const& e)
        {
	        project(pSource)->writeMsg(e.msg);
            err = e.code;
  	    }
        catch (...)
        {
            err = 208; //Unspecified error
        }
        if ( err > 0 )
        {
            EN_clearProject(pClone);
        }
        remove(tmpFile.c_str());
        return err;
    }
    return 208;
}